

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void build_ycc_rgb_table(j_decompress_ptr cinfo)

{
  jpeg_upsampler *pjVar1;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var2;
  void *pvVar3;
  _func_void_j_decompress_ptr *p_Var4;
  long local_28;
  INT32 x;
  int i;
  my_upsample_ptr upsample;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->upsample;
  p_Var2 = (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
            *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x400);
  pjVar1[1].upsample = p_Var2;
  pvVar3 = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x400);
  *(void **)&pjVar1[1].need_context_rows = pvVar3;
  p_Var4 = (_func_void_j_decompress_ptr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x800);
  pjVar1[2].start_pass = p_Var4;
  p_Var2 = (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
            *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x800);
  pjVar1[2].upsample = p_Var2;
  local_28 = -0x80;
  for (x._4_4_ = 0; x._4_4_ < 0x100; x._4_4_ = x._4_4_ + 1) {
    *(int *)(pjVar1[1].upsample + (long)x._4_4_ * 4) =
         (int)((ulong)(local_28 * 0x166e9 + 0x8000) >> 0x10);
    *(int *)(*(long *)&pjVar1[1].need_context_rows + (long)x._4_4_ * 4) =
         (int)((ulong)(local_28 * 0x1c5a2 + 0x8000) >> 0x10);
    *(long *)(pjVar1[2].start_pass + (long)x._4_4_ * 8) = local_28 * -0xb6d2;
    *(long *)(pjVar1[2].upsample + (long)x._4_4_ * 8) = local_28 * -0x581a + 0x8000;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

LOCAL(void)
build_ycc_rgb_table (j_decompress_ptr cinfo)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  int i;
  INT32 x;
  SHIFT_TEMPS

  cconvert->Cr_r_tab = (int *)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				(MAXJSAMPLE+1) * SIZEOF(int));
  cconvert->Cb_b_tab = (int *)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				(MAXJSAMPLE+1) * SIZEOF(int));
  cconvert->Cr_g_tab = (INT32 *)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				(MAXJSAMPLE+1) * SIZEOF(INT32));
  cconvert->Cb_g_tab = (INT32 *)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				(MAXJSAMPLE+1) * SIZEOF(INT32));

  for (i = 0, x = -CENTERJSAMPLE; i <= MAXJSAMPLE; i++, x++) {
    /* i is the actual input pixel value, in the range 0..MAXJSAMPLE */
    /* The Cb or Cr value we are thinking of is x = i - CENTERJSAMPLE */
    /* Cr=>R value is nearest int to 1.40200 * x */
    cconvert->Cr_r_tab[i] = (int)
		    RIGHT_SHIFT(FIX(1.40200) * x + ONE_HALF, SCALEBITS);
    /* Cb=>B value is nearest int to 1.77200 * x */
    cconvert->Cb_b_tab[i] = (int)
		    RIGHT_SHIFT(FIX(1.77200) * x + ONE_HALF, SCALEBITS);
    /* Cr=>G value is scaled-up -0.71414 * x */
    cconvert->Cr_g_tab[i] = (- FIX(0.71414)) * x;
    /* Cb=>G value is scaled-up -0.34414 * x */
    /* We also add in ONE_HALF so that need not do it in inner loop */
    cconvert->Cb_g_tab[i] = (- FIX(0.34414)) * x + ONE_HALF;
  }
}